

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int changedline(Proto *p,int oldpc,int newpc)

{
  int iVar1;
  int iVar2;
  int local_28;
  int lineinfo;
  int pc;
  int delta;
  int newpc_local;
  int oldpc_local;
  Proto *p_local;
  
  if (p->lineinfo == (ls_byte *)0x0) {
    p_local._4_4_ = 0;
  }
  else if (newpc - oldpc < 0x40) {
    lineinfo = 0;
    local_28 = oldpc;
    do {
      local_28 = local_28 + 1;
      if (p->lineinfo[local_28] == -0x80) goto LAB_0010e38a;
      lineinfo = p->lineinfo[local_28] + lineinfo;
    } while (local_28 != newpc);
    p_local._4_4_ = (uint)(lineinfo != 0);
  }
  else {
LAB_0010e38a:
    iVar1 = luaG_getfuncline(p,oldpc);
    iVar2 = luaG_getfuncline(p,newpc);
    p_local._4_4_ = (uint)(iVar1 != iVar2);
  }
  return p_local._4_4_;
}

Assistant:

static int changedline (const Proto *p, int oldpc, int newpc) {
  if (p->lineinfo == NULL)  /* no debug information? */
    return 0;
  if (newpc - oldpc < MAXIWTHABS / 2) {  /* not too far apart? */
    int delta = 0;  /* line difference */
    int pc = oldpc;
    for (;;) {
      int lineinfo = p->lineinfo[++pc];
      if (lineinfo == ABSLINEINFO)
        break;  /* cannot compute delta; fall through */
      delta += lineinfo;
      if (pc == newpc)
        return (delta != 0);  /* delta computed successfully */
    }
  }
  /* either instructions are too far apart or there is an absolute line
     info in the way; compute line difference explicitly */
  return (luaG_getfuncline(p, oldpc) != luaG_getfuncline(p, newpc));
}